

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockNamedValue.cpp
# Opt level: O2

long __thiscall MockNamedValue::getLongIntValue(MockNamedValue *this)

{
  SimpleString *left;
  bool bVar1;
  ulong uVar2;
  UtestShell *pUVar3;
  char *pcVar4;
  TestTerminator *pTVar5;
  SimpleString local_30;
  
  left = &this->type_;
  SimpleString::SimpleString(&local_30,"int");
  bVar1 = operator==(left,&local_30);
  SimpleString::~SimpleString(&local_30);
  if (bVar1) {
    uVar2 = (ulong)(this->value_).intValue_;
  }
  else {
    SimpleString::SimpleString(&local_30,"unsigned int");
    bVar1 = operator==(left,&local_30);
    SimpleString::~SimpleString(&local_30);
    if (bVar1) {
      uVar2 = (ulong)(this->value_).unsignedIntValue_;
    }
    else {
      pUVar3 = UtestShell::getCurrent();
      pcVar4 = SimpleString::asCharString(left);
      pTVar5 = UtestShell::getCurrentTestTerminator();
      (*pUVar3->_vptr_UtestShell[9])
                (pUVar3,"long int",pcVar4,0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTestExt/MockNamedValue.cpp"
                 ,0xe5,pTVar5);
      uVar2 = (this->value_).longIntValue_;
    }
  }
  return uVar2;
}

Assistant:

long int MockNamedValue::getLongIntValue() const
{
    if(type_ == "int")
        return value_.intValue_;
    else if(type_ == "unsigned int")
        return (long int)value_.unsignedIntValue_;
    else
    {
        STRCMP_EQUAL("long int", type_.asCharString());
        return value_.longIntValue_;
    }
}